

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O1

int ds_list_find_index(DsList *list,void *data)

{
  DS_BOOL DVar1;
  int iVar2;
  DsListEntry *pDVar3;
  
  if (((list != (DsList *)0x0) && (list->equal != (_func_DS_BOOL_void_ptr_void_ptr *)0x0)) &&
     (pDVar3 = list->entry, pDVar3 != (DsListEntry *)0x0)) {
    iVar2 = 0;
    do {
      DVar1 = (*list->equal)(data,pDVar3->data);
      if (DVar1 != 0) {
        return iVar2;
      }
      iVar2 = iVar2 + 1;
      pDVar3 = pDVar3->next;
    } while (pDVar3 != (DsListEntry *)0x0);
  }
  return -1;
}

Assistant:

int ds_list_find_index(DsList *list, void *data)
{
    if (NULL == list || NULL == list->equal || NULL == list->entry)
        return -1;
    DsListEntry *entry = list->entry;
    int i = 0;
    while (entry)
    {
        if ((*(list->equal))(data, entry->data))
            return i;
        i++;
        entry = entry->next;
    }
    return -1;
}